

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9_hashmap_intersect(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  uint uVar1;
  sxu32 sVar2;
  jx9_hashmap_node *pNode;
  void *pvVar3;
  int iVar4;
  jx9_value *pSrc;
  jx9_vm *pjVar5;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar6;
  ulong uVar7;
  jx9_hashmap_node **ppjVar8;
  int iVar9;
  
  if (0 < nArg) {
    if (((*apArg)->iFlags & 0x40) != 0) {
      if (nArg == 1) {
        jx9_result_value(pCtx,*apArg);
        return 0;
      }
      pSrc = jx9_context_new_array(pCtx);
      if (pSrc != (jx9_value *)0x0) {
        iVar9 = *(int *)(((*apArg)->x).iVal + 0x2c);
        if (iVar9 != 0) {
          ppjVar8 = (jx9_hashmap_node **)(((*apArg)->x).iVal + 0x10);
          uVar6 = extraout_RDX;
          do {
            pNode = *ppjVar8;
            uVar1 = pNode->nValIdx;
            pjVar5 = pNode->pMap->pVm;
            if ((uVar1 < (pjVar5->aMemObj).nUsed) &&
               (pvVar3 = (pjVar5->aMemObj).pBase, pvVar3 != (void *)0x0)) {
              sVar2 = (pjVar5->aMemObj).eSize;
              uVar7 = 1;
              do {
                if (((apArg[uVar7]->iFlags & 0x40) != 0) &&
                   (iVar4 = HashmapFindValue((jx9_hashmap *)(apArg[uVar7]->x).pOther,
                                             (jx9_value *)((long)pvVar3 + (ulong)(uVar1 * sVar2)),
                                             (jx9_hashmap_node **)0x1,(int)pjVar5),
                   uVar6 = extraout_RDX_00, iVar4 != 0)) goto LAB_00138383;
                uVar7 = uVar7 + 1;
              } while ((uint)nArg != uVar7);
              HashmapInsertNode((jx9_hashmap *)(pSrc->x).pOther,pNode,(int)uVar6);
              uVar6 = extraout_RDX_01;
            }
LAB_00138383:
            ppjVar8 = &pNode->pPrev;
            iVar9 = iVar9 + -1;
          } while (iVar9 != 0);
        }
        jx9MemObjStore(pSrc,pCtx->pRet);
        return 0;
      }
    }
  }
  jx9MemObjRelease(pCtx->pRet);
  return 0;
}

Assistant:

static int jx9_hashmap_intersect(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_hashmap_node *pEntry;
	jx9_hashmap *pSrc, *pMap;
	jx9_value *pArray;
	jx9_value *pVal;
	sxi32 rc;
	sxu32 n;
	int i;
	if( nArg < 1 || !jx9_value_is_json_array(apArg[0]) ){
		/* Missing arguments, return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	if( nArg == 1 ){
		/* Return the first array since we cannot perform a diff */
		jx9_result_value(pCtx, apArg[0]);
		return JX9_OK;
	}
	/* Create a new array */
	pArray = jx9_context_new_array(pCtx);
	if( pArray == 0 ){
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Point to the internal representation of the source hashmap */
	pSrc = (jx9_hashmap *)apArg[0]->x.pOther;
	/* Perform the intersection */
	pEntry = pSrc->pFirst;
	n = pSrc->nEntry;
	for(;;){
		if( n < 1 ){
			break;
		}
		/* Extract the node value */
		pVal = HashmapExtractNodeValue(pEntry);
		if( pVal ){
			for( i = 1 ; i < nArg ; i++ ){
				if( !jx9_value_is_json_array(apArg[i])) {
					/* ignore */
					continue;
				}
				/* Point to the internal representation of the hashmap */
				pMap = (jx9_hashmap *)apArg[i]->x.pOther;
				/* Perform the lookup */
				rc = HashmapFindValue(pMap, pVal, 0, TRUE);
				if( rc != SXRET_OK ){
					/* Value does not exist */
					break;
				}
			}
			if( i >= nArg ){
				/* Perform the insertion */
				HashmapInsertNode((jx9_hashmap *)pArray->x.pOther, pEntry, TRUE);
			}
		}
		/* Point to the next entry */
		pEntry = pEntry->pPrev; /* Reverse link */
		n--;
	}
	/* Return the freshly created array */
	jx9_result_value(pCtx, pArray);
	return JX9_OK;
}